

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

RC __thiscall
QO_Manager::IsValidIndexCond
          (QO_Manager *this,int relsJoined,int condIndex,int relIdx,int *attrIndex)

{
  RelAttr *pRVar1;
  RC RVar2;
  Condition *pCVar3;
  int local_8c;
  char *pcStack_88;
  int firstRel_1;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 local_62;
  byte local_61;
  bool secondBitSet;
  char *pcStack_60;
  bool firstBitSet;
  char *local_58;
  char *local_50;
  char *local_48;
  int local_3c;
  int local_38;
  int secondRel;
  int firstRel;
  RC rc;
  int *attrIndex_local;
  int local_20;
  int relIdx_local;
  int condIndex_local;
  int relsJoined_local;
  QO_Manager *this_local;
  
  secondRel = 0;
  _firstRel = attrIndex;
  attrIndex_local._4_4_ = relIdx;
  local_20 = condIndex;
  relIdx_local = relsJoined;
  _condIndex_local = this;
  if (this->conds[condIndex].bRhsIsAttr == 0) {
    AttrToRelIndex(this,this->conds[condIndex].lhsAttr,&local_8c);
    if (local_8c == attrIndex_local._4_4_) {
      RVar2 = QL_Manager::GetAttrCatEntryPos(this->qlm,this->conds[local_20].lhsAttr,_firstRel);
      if (RVar2 != 0) {
        return RVar2;
      }
      return 0;
    }
  }
  else {
    pCVar3 = this->conds + condIndex;
    local_50 = (pCVar3->lhsAttr).relName;
    local_48 = (pCVar3->lhsAttr).attrName;
    AttrToRelIndex(this,pCVar3->lhsAttr,&local_38);
    pRVar1 = &this->conds[local_20].rhsAttr;
    pcStack_60 = pRVar1->relName;
    local_58 = this->conds[local_20].rhsAttr.attrName;
    AttrToRelIndex(this,*pRVar1,&local_3c);
    local_61 = IsBitSet(this,local_38,relIdx_local);
    local_62 = IsBitSet(this,local_3c,relIdx_local);
    if (((local_61 & 1) != 0) && (local_3c == attrIndex_local._4_4_)) {
      pRVar1 = &this->conds[local_20].rhsAttr;
      local_78 = pRVar1->relName;
      local_70 = this->conds[local_20].rhsAttr.attrName;
      RVar2 = QL_Manager::GetAttrCatEntryPos(this->qlm,*pRVar1,_firstRel);
      if (RVar2 != 0) {
        return RVar2;
      }
      return 0;
    }
    if (((bool)local_62) && (local_38 == attrIndex_local._4_4_)) {
      pCVar3 = this->conds + local_20;
      pcStack_88 = (pCVar3->lhsAttr).relName;
      local_80 = (pCVar3->lhsAttr).attrName;
      RVar2 = QL_Manager::GetAttrCatEntryPos(this->qlm,pCVar3->lhsAttr,_firstRel);
      if (RVar2 != 0) {
        return RVar2;
      }
      return 0;
    }
  }
  return secondRel;
}

Assistant:

RC QO_Manager::IsValidIndexCond(int relsJoined, int condIndex, int relIdx, int &attrIndex){
  RC rc = 0;
  // For attr-attr conditions, one attribute must be in relIdx, and another
  // must be in relsJoined
  if(conds[condIndex].bRhsIsAttr){
    int firstRel, secondRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    AttrToRelIndex(conds[condIndex].rhsAttr, secondRel);
    bool firstBitSet = IsBitSet(firstRel, relsJoined);
    bool secondBitSet = IsBitSet(secondRel, relsJoined);
    if(firstBitSet && secondRel == relIdx){
      if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].rhsAttr, attrIndex)))
        return (rc);
      return (0);
    }
    else if(secondBitSet && firstRel == relIdx){
      if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].lhsAttr, attrIndex)))
        return (rc);
      return (0);
    }
  }
  // otherwise, attr-value conditions must have attribute in relIdx
  else{
    int firstRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    if(firstRel == relIdx){
      if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].lhsAttr, attrIndex)))
        return (rc);
      return (0);
    }
  }

  return (rc);
}